

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O3

int VP8RecordCoeffs(int ctx,VP8Residual *res)

{
  ushort uVar1;
  StatsArray *paapVar2;
  int16_t *piVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  short sVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  proba_t (*papVar13) [11];
  long lVar14;
  uint uVar15;
  uint uVar16;
  
  uVar7 = res->first;
  uVar8 = (ulong)(int)uVar7;
  paapVar2 = res->stats;
  papVar13 = paapVar2[uVar8] + ctx;
  if (res->last < 0) {
    iVar4 = 0;
  }
  else {
    if ((int)uVar7 <= res->last) {
      piVar3 = res->coeffs;
      do {
        uVar7 = (*papVar13)[0];
        uVar11 = uVar7 + 1 >> 1 & 0x7fff7fff;
        if (uVar7 < 0xfffe0000) {
          uVar11 = uVar7;
        }
        (*papVar13)[0] = uVar11 + 0x10001;
        uVar7 = (int)uVar8 + 1;
        sVar9 = piVar3[(int)uVar8];
        if (sVar9 == 0) {
          lVar14 = 0;
          do {
            uVar11 = (*papVar13)[1];
            uVar10 = uVar11 + 1 >> 1 & 0x7fff7fff;
            if (uVar11 < 0xfffe0000) {
              uVar10 = uVar11;
            }
            (*papVar13)[1] = uVar10 + 0x10000;
            papVar13 = (proba_t (*) [11])
                       ((long)*paapVar2 +
                       (ulong)""[lVar14 + (int)uVar7] * 0x80 + (ulong)""[lVar14 + (int)uVar7] * 4);
            sVar9 = piVar3[(int)uVar7 + lVar14];
            lVar14 = lVar14 + 1;
          } while (sVar9 == 0);
          uVar7 = uVar7 + (int)lVar14;
        }
        uVar8 = (ulong)uVar7;
        uVar5 = (uint)sVar9;
        uVar11 = (*papVar13)[1];
        uVar10 = (*papVar13)[2];
        uVar15 = -(uint)(0x7ffdffff < (int)(uVar11 ^ 0x80000000));
        uVar16 = -(uint)(0x7ffdffff < (int)(uVar10 ^ 0x80000000));
        *(ulong *)(*papVar13 + 1) =
             CONCAT44((0x10001 - (uint)(uVar5 + 1 < 3)) +
                      (~uVar16 & uVar10 | uVar10 + 1 >> 1 & uVar16 & 0x7fff7fff),
                      (~uVar15 & uVar11 | uVar11 + 1 >> 1 & uVar15 & 0x7fff7fff) + 0x10001);
        lVar14 = 1;
        if (2 < uVar5 + 1) {
          uVar11 = -uVar5;
          if (0 < (int)uVar5) {
            uVar11 = uVar5;
          }
          if (0x42 < uVar11) {
            uVar11 = 0x43;
          }
          uVar12 = (ulong)*(ushort *)(&DAT_0015af6c + (ulong)uVar11 * 4);
          lVar14 = 2;
          if (1 < *(ushort *)(&DAT_0015af6c + (ulong)uVar11 * 4)) {
            uVar1 = *(ushort *)(&DAT_0015af6e + (ulong)uVar11 * 4);
            lVar6 = 0;
            do {
              if ((uVar12 & 2) != 0) {
                uVar11 = (*papVar13)[lVar6 + 3];
                uVar10 = uVar11 + 1 >> 1 & 0x7fff7fff;
                if (uVar11 < 0xfffe0000) {
                  uVar10 = uVar11;
                }
                (*papVar13)[lVar6 + 3] =
                     (0x10001 - (uint)((uVar1 >> ((byte)lVar6 & 0x1f) & 2) == 0)) + uVar10;
              }
              uVar11 = (uint)uVar12;
              uVar12 = uVar12 >> 1;
              lVar6 = lVar6 + 1;
            } while (3 < uVar11);
          }
        }
        papVar13 = (proba_t (*) [11])
                   ((long)*paapVar2 +
                   (ulong)""[(int)uVar7] * 0x80 + (ulong)""[(int)uVar7] * 4 + lVar14 * 0x2c);
      } while ((int)uVar7 <= res->last);
    }
    iVar4 = 1;
    if (0xf < (int)uVar7) {
      return 1;
    }
  }
  uVar7 = (*papVar13)[0];
  uVar11 = uVar7 + 1 >> 1 & 0x7fff7fff;
  if (uVar7 < 0xfffe0000) {
    uVar11 = uVar7;
  }
  (*papVar13)[0] = uVar11 + 0x10000;
  return iVar4;
}

Assistant:

int VP8RecordCoeffs(int ctx, const VP8Residual* const res) {
  int n = res->first;
  // should be stats[VP8EncBands[n]], but it's equivalent for n=0 or 1
  proba_t* s = res->stats[n][ctx];
  if (res->last  < 0) {
    VP8RecordStats(0, s + 0);
    return 0;
  }
  while (n <= res->last) {
    int v;
    VP8RecordStats(1, s + 0);  // order of record doesn't matter
    while ((v = res->coeffs[n++]) == 0) {
      VP8RecordStats(0, s + 1);
      s = res->stats[VP8EncBands[n]][0];
    }
    VP8RecordStats(1, s + 1);
    if (!VP8RecordStats(2u < (unsigned int)(v + 1), s + 2)) {  // v = -1 or 1
      s = res->stats[VP8EncBands[n]][1];
    } else {
      v = abs(v);
#if !defined(USE_LEVEL_CODE_TABLE)
      if (!VP8RecordStats(v > 4, s + 3)) {
        if (VP8RecordStats(v != 2, s + 4))
          VP8RecordStats(v == 4, s + 5);
      } else if (!VP8RecordStats(v > 10, s + 6)) {
        VP8RecordStats(v > 6, s + 7);
      } else if (!VP8RecordStats((v >= 3 + (8 << 2)), s + 8)) {
        VP8RecordStats((v >= 3 + (8 << 1)), s + 9);
      } else {
        VP8RecordStats((v >= 3 + (8 << 3)), s + 10);
      }
#else
      if (v > MAX_VARIABLE_LEVEL) {
        v = MAX_VARIABLE_LEVEL;
      }

      {
        const int bits = VP8LevelCodes[v - 1][1];
        int pattern = VP8LevelCodes[v - 1][0];
        int i;
        for (i = 0; (pattern >>= 1) != 0; ++i) {
          const int mask = 2 << i;
          if (pattern & 1) VP8RecordStats(!!(bits & mask), s + 3 + i);
        }
      }
#endif
      s = res->stats[VP8EncBands[n]][2];
    }
  }
  if (n < 16) VP8RecordStats(0, s + 0);
  return 1;
}